

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O1

bool __thiscall
duckdb_snappy::SnappyIOVecWriter::AppendFromSelf
          (SnappyIOVecWriter *this,size_t offset,size_t len,char **param_3)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  iovec *piVar4;
  ulong uVar5;
  ulong uVar6;
  undefined8 *puVar7;
  iovec *piVar8;
  char *pcVar9;
  ulong __n;
  size_t sVar10;
  size_t sVar11;
  ulong uVar12;
  void *__src;
  bool bVar13;
  
  if (this->total_written_ <= offset - 1) {
    return false;
  }
  if (len <= this->output_limit_ - this->total_written_) {
    piVar4 = this->curr_iov_;
    sVar10 = piVar4->iov_len - this->curr_iov_remaining_;
    piVar8 = piVar4;
    sVar11 = sVar10;
    if (offset != 0) {
      do {
        sVar10 = sVar11 - offset;
        piVar8 = piVar4;
        if (offset <= sVar11) break;
        piVar8 = piVar4 + -1;
        offset = offset - sVar11;
        sVar10 = piVar4[-1].iov_len;
        piVar4 = piVar8;
        sVar11 = sVar10;
      } while (offset != 0);
    }
    do {
      while( true ) {
        if (len == 0) {
          return len == 0;
        }
        piVar4 = this->curr_iov_;
        if (piVar8 == piVar4) break;
        sVar11 = piVar8->iov_len;
        uVar6 = sVar11 - sVar10;
        if (len < sVar11 - sVar10) {
          uVar6 = len;
        }
        uVar5 = sVar11 - sVar10;
        if (sVar11 != sVar10) {
          __src = (void *)((long)piVar8->iov_base + sVar10);
          uVar12 = uVar6;
          do {
            if (this->curr_iov_remaining_ == 0) {
              piVar4 = this->curr_iov_;
              if (this->output_iov_end_ <= piVar4 + 1) break;
              this->curr_iov_ = piVar4 + 1;
              this->curr_iov_output_ = (char *)piVar4[1].iov_base;
              this->curr_iov_remaining_ = piVar4[1].iov_len;
            }
            __n = this->curr_iov_remaining_;
            if (uVar12 <= this->curr_iov_remaining_) {
              __n = uVar12;
            }
            switchD_015ff80e::default(this->curr_iov_output_,__src,__n);
            this->curr_iov_output_ = this->curr_iov_output_ + __n;
            this->curr_iov_remaining_ = this->curr_iov_remaining_ - __n;
            this->total_written_ = this->total_written_ + __n;
            __src = (void *)((long)__src + __n);
            uVar12 = uVar12 - __n;
          } while (uVar12 != 0);
        }
        if (uVar5 < len) {
          sVar10 = 0;
        }
        piVar8 = piVar8 + (uVar5 < len);
        len = len - uVar6;
      }
      uVar6 = this->curr_iov_remaining_;
      if (uVar6 == 0) {
        iVar3 = 1;
        if (piVar4 + 1 < this->output_iov_end_) {
          this->curr_iov_ = piVar4 + 1;
          this->curr_iov_output_ = (char *)piVar4[1].iov_base;
          this->curr_iov_remaining_ = piVar4[1].iov_len;
          iVar3 = 4;
        }
      }
      else {
        uVar5 = len;
        if (uVar6 < len) {
          uVar5 = uVar6;
        }
        puVar7 = (undefined8 *)((long)piVar8->iov_base + sVar10);
        pcVar2 = this->curr_iov_output_;
        pcVar1 = pcVar2 + uVar5;
        pcVar9 = pcVar2;
        if ((ulong)((long)pcVar2 - (long)puVar7) < 8) {
          uVar12 = (long)pcVar2 - (long)puVar7;
          if (pcVar2 + (uVar6 - 0xb) < pcVar2) {
            if (0 < (long)uVar5) {
              uVar6 = 0;
              do {
                pcVar2[uVar6] = *(char *)((long)puVar7 + uVar6);
                uVar6 = uVar6 + 1;
              } while (uVar5 != uVar6);
            }
          }
          else {
            do {
              *(undefined8 *)pcVar9 = *puVar7;
              pcVar9 = pcVar9 + uVar12;
              bVar13 = uVar12 < 4;
              uVar12 = uVar12 * 2;
            } while (bVar13);
            if (pcVar9 < pcVar1) goto LAB_01bff379;
          }
        }
        else {
LAB_01bff379:
          if (pcVar2 + (uVar6 - 0xf) < pcVar1) {
            AppendFromSelf();
          }
          else {
            *(undefined8 *)pcVar9 = *puVar7;
            *(undefined8 *)(pcVar9 + 8) = puVar7[1];
            if (pcVar9 + 0x10 < pcVar1) {
              *(undefined8 *)(pcVar9 + 0x10) = puVar7[2];
              *(undefined8 *)(pcVar9 + 0x18) = puVar7[3];
            }
            if (pcVar9 + 0x20 < pcVar1) {
              *(undefined8 *)(pcVar9 + 0x20) = puVar7[4];
              *(undefined8 *)(pcVar9 + 0x28) = puVar7[5];
            }
            if (pcVar9 + 0x30 < pcVar1) {
              *(undefined8 *)(pcVar9 + 0x30) = puVar7[6];
              *(undefined8 *)(pcVar9 + 0x38) = puVar7[7];
            }
          }
        }
        this->curr_iov_output_ = this->curr_iov_output_ + uVar5;
        this->curr_iov_remaining_ = this->curr_iov_remaining_ - uVar5;
        this->total_written_ = this->total_written_ + uVar5;
        sVar10 = sVar10 + uVar5;
        len = len - uVar5;
        iVar3 = 0;
      }
    } while ((iVar3 == 4) || (iVar3 == 0));
  }
  return false;
}

Assistant:

inline bool AppendFromSelf(size_t offset, size_t len, char**) {
    // See SnappyArrayWriter::AppendFromSelf for an explanation of
    // the "offset - 1u" trick.
    if (offset - 1u >= total_written_) {
      return false;
    }
    const size_t space_left = output_limit_ - total_written_;
    if (len > space_left) {
      return false;
    }

    // Locate the iovec from which we need to start the copy.
    const iovec* from_iov = curr_iov_;
    size_t from_iov_offset = curr_iov_->iov_len - curr_iov_remaining_;
    while (offset > 0) {
      if (from_iov_offset >= offset) {
        from_iov_offset -= offset;
        break;
      }

      offset -= from_iov_offset;
      --from_iov;
#if !defined(NDEBUG)
      assert(from_iov >= output_iov_);
#endif  // !defined(NDEBUG)
      from_iov_offset = from_iov->iov_len;
    }

    // Copy <len> bytes starting from the iovec pointed to by from_iov_index to
    // the current iovec.
    while (len > 0) {
      assert(from_iov <= curr_iov_);
      if (from_iov != curr_iov_) {
        const size_t to_copy =
            std::min(from_iov->iov_len - from_iov_offset, len);
        AppendNoCheck(GetIOVecPointer(from_iov, from_iov_offset), to_copy);
        len -= to_copy;
        if (len > 0) {
          ++from_iov;
          from_iov_offset = 0;
        }
      } else {
        size_t to_copy = curr_iov_remaining_;
        if (to_copy == 0) {
          // This iovec is full. Go to the next one.
          if (curr_iov_ + 1 >= output_iov_end_) {
            return false;
          }
          ++curr_iov_;
          curr_iov_output_ = reinterpret_cast<char*>(curr_iov_->iov_base);
          curr_iov_remaining_ = curr_iov_->iov_len;
          continue;
        }
        if (to_copy > len) {
          to_copy = len;
        }
        assert(to_copy > 0);

        IncrementalCopy(GetIOVecPointer(from_iov, from_iov_offset),
                        curr_iov_output_, curr_iov_output_ + to_copy,
                        curr_iov_output_ + curr_iov_remaining_);
        curr_iov_output_ += to_copy;
        curr_iov_remaining_ -= to_copy;
        from_iov_offset += to_copy;
        total_written_ += to_copy;
        len -= to_copy;
      }
    }

    return true;
  }